

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.c
# Opt level: O0

uint32_t radixsort_u32(uint32_t kRadixBits,uint32_t *keys_in,uint32_t *keys_temp,uint32_t *values_in
                      ,uint32_t *values_temp,uint32_t size)

{
  uint32_t *puVar1;
  uint32_t *keys_out;
  uint32_t *values_in_00;
  long lVar2;
  uint32_t mask;
  uint kHistBuckets_00;
  uint kHistSize_00;
  uint32_t *hist;
  uint32_t shift;
  undefined8 auStack_b0 [2];
  uint32_t auStack_a0 [2];
  uint32_t *local_98;
  uint32_t *local_90;
  uint32_t *offset;
  uint32_t in;
  uint32_t bucket;
  uint32_t kHistMask;
  uint32_t out;
  uint32_t *values [2];
  uint32_t *keys [2];
  unsigned_long __vla_expr0;
  uint32_t kHistSize;
  uint32_t kHistBuckets;
  uint32_t size_local;
  uint32_t *values_temp_local;
  uint32_t *values_in_local;
  uint32_t *keys_temp_local;
  uint32_t *keys_in_local;
  uint32_t kRadixBits_local;
  
  kHistBuckets_00 = SUB164((ZEXT416(0) << 0x40 | ZEXT816(0x1f)) / ZEXT416(kRadixBits),0) + 1;
  keys_in_local._4_1_ = (byte)kRadixBits;
  kHistSize_00 = 1 << (keys_in_local._4_1_ & 0x1f);
  lVar2 = -((ulong)(kHistBuckets_00 * kHistSize_00) * 4 + 0xf & 0xfffffffffffffff0);
  local_98 = (uint32_t *)((long)&local_98 + lVar2);
  *(undefined8 *)((long)auStack_a0 + lVar2) = 0x17d70c;
  memset((uint32_t *)((long)&local_98 + lVar2),0,(ulong)kHistBuckets_00 * 4 * (ulong)kHistSize_00);
  puVar1 = local_98;
  *(undefined8 *)((long)auStack_a0 + lVar2) = 0x17d729;
  init_histograms_u32(kRadixBits,kHistBuckets_00,kHistSize_00,puVar1,keys_in,size);
  puVar1 = local_98;
  *(undefined8 *)((long)auStack_a0 + lVar2) = 0x17d73b;
  sum_histograms(kHistBuckets_00,kHistSize_00,puVar1);
  values[1] = keys_in;
  _kHistMask = values_in;
  values[0] = values_temp;
  bucket = 0;
  in = kHistSize_00 - 1;
  for (offset._4_4_ = 0; mask = in, offset._4_4_ < kHistBuckets_00; offset._4_4_ = offset._4_4_ + 1)
  {
    offset._0_4_ = offset._4_4_ & 1;
    bucket = (uint32_t)(((uint)offset != 0 ^ 0xffU) & 1);
    hist = local_98 + offset._4_4_ * kHistSize_00;
    local_90 = hist;
    shift = offset._4_4_ * kRadixBits;
    puVar1 = values[(ulong)(uint)offset + 1];
    keys_out = values[(ulong)bucket + 1];
    values_in_00 = *(uint32_t **)(&kHistMask + (ulong)(uint)offset * 2);
    *(undefined8 *)((long)auStack_b0 + lVar2 + 8) = *(undefined8 *)(&kHistMask + (ulong)bucket * 2);
    *(uint32_t *)((long)auStack_a0 + lVar2) = size;
    *(undefined8 *)((long)auStack_b0 + lVar2) = 0x17d7fd;
    radixpass_u32(hist,shift,mask,puVar1,keys_out,values_in_00,
                  *(uint32_t **)((long)auStack_b0 + lVar2 + 8),
                  *(uint32_t *)((long)auStack_a0 + lVar2));
  }
  return bucket;
}

Assistant:

static inline uint32_t radixsort_u32(uint32_t kRadixBits, uint32_t* restrict keys_in,
    uint32_t* restrict keys_temp, uint32_t* restrict values_in, uint32_t* values_temp,
    uint32_t size)
{
    const uint32_t kHistBuckets = 1 + (((sizeof(uint32_t) * 8) - 1) / kRadixBits);
    const uint32_t kHistSize = 1 << kRadixBits;
    uint32_t hist[kHistBuckets * kHistSize];
    memset(hist, 0, sizeof(uint32_t) * kHistBuckets * kHistSize);

    init_histograms_u32(kRadixBits, kHistBuckets, kHistSize, hist, keys_in, size);

    sum_histograms(kHistBuckets, kHistSize, hist);

    // alternate input and output buffers on each radix pass
    uint32_t* restrict keys[2] = {keys_in, keys_temp};
    uint32_t* restrict values[2] = {values_in, values_temp};

    uint32_t out = 0;
    const uint32_t kHistMask = kHistSize - 1;
    for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
    {
        const uint32_t in = bucket & 1;
        out = !in;
        uint32_t* restrict offset = hist + (bucket * kHistSize);
        radixpass_u32(offset, bucket * kRadixBits, kHistMask, keys[in], keys[out], values[in],
            values[out], size);
    }

    return out;
}